

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O3

void decompressBlockTHUMB58Hc
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint8 paint_colors [4] [3];
  uint8 colors [2] [3];
  uint8 local_42 [12];
  byte local_36;
  byte local_35;
  byte local_34;
  char local_33;
  char local_32;
  char local_31;
  
  uVar7 = block_part1 >> 0xe;
  bVar2 = (byte)(block_part1 >> 10);
  local_36 = (byte)((block_part1 >> 0x16) << 4) | (byte)(block_part1 >> 0x16) & 0xf;
  local_35 = (byte)((block_part1 >> 0x12) << 4) | (byte)(block_part1 >> 0x12) & 0xf;
  local_34 = (byte)(uVar7 << 4) | (byte)uVar7 & 0xf;
  local_33 = bVar2 * '\x10' + (bVar2 & 0xf);
  local_32 = (char)((block_part1 >> 6) << 4) + ((byte)(block_part1 >> 6) & 0xf);
  local_31 = ((byte)(block_part1 >> 2) & 0xf) * '\x11';
  iVar8 = 0;
  calculatePaintColors58H
            ((block_part1 >> 2 & 0xfff) <= (uVar7 & 0xfff) | (char)block_part1 * '\x02' & 6U,'\0',
             (uint8 (*) [3])&local_36,(uint8 (*) [3])local_42);
  iVar4 = (width * starty + startx) * channels;
  lVar3 = 0;
  do {
    lVar6 = 0;
    iVar5 = iVar4;
    do {
      uVar7 = (int)lVar6 + iVar8;
      lVar1 = (ulong)((uint)((block_part2 >> (uVar7 & 0x1f) & 1) != 0) +
                     (block_part2 >> ((byte)uVar7 & 0x1f | 0x10) & 1) * 2) * 3;
      img[iVar5] = local_42[lVar1];
      img[(long)iVar5 + 1] = local_42[lVar1 + 1];
      img[(long)iVar5 + 2] = local_42[lVar1 + 2];
      lVar6 = lVar6 + 1;
      iVar5 = iVar5 + channels * width;
    } while (lVar6 != 4);
    lVar3 = lVar3 + 1;
    iVar4 = iVar4 + channels;
    iVar8 = iVar8 + 4;
  } while (lVar3 != 4);
  return;
}

Assistant:

void decompressBlockTHUMB58Hc(unsigned int block_part1, unsigned int block_part2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	unsigned int col0, col1;
	uint8 colors[2][3];
	uint8 colorsRGB444[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];
	
	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 57);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 53);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 49);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 45);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 41);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 37);

	distance = 0;
	distance = (GETBITSHIGH(block_part1, 2, 33)) << 1;

	col0 = GETBITSHIGH(block_part1, 12, 57);
	col1 = GETBITSHIGH(block_part1, 12, 45);

	if(col0 >= col1)
	{
		distance |= 1;
	}

	// Extend the two colors to RGB888	
	decompressColor(R_BITS58H, G_BITS58H, B_BITS58H, colorsRGB444, colors);	
	
	calculatePaintColors58H(distance, PATTERN_H, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channels*((starty+y)*width+startx+x)+R] =
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channels*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channels*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
		}
	}
}